

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::closeObject(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  long lVar2;
  Count *pCVar3;
  string *psVar4;
  size_type sVar5;
  size_type *psVar6;
  qpdf_offset_t qVar7;
  size_t in_RCX;
  size_t idx;
  NewObject *this_00;
  
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x280eb2,(void *)0x8,in_RCX);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar1->pipeline,0x2812ff,(void *)0x1,in_RCX);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  idx = (size_t)objid;
  lVar2 = *(long *)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                    super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                    super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                    ._M_impl;
  if (idx < (ulong)((long)*(pointer *)
                           ((long)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                   super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   .
                                   super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                           + 8) - lVar2 >> 5)) {
    this_00 = (NewObject *)(lVar2 + idx * 0x20);
  }
  else {
    this_00 = ObjTable<QPDFWriter::NewObject>::large_element
                        (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,idx);
  }
  pCVar3 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pipeline;
  psVar4 = pCVar3->str;
  psVar6 = (size_type *)&pCVar3->count;
  if (psVar4 != (string *)0x0) {
    psVar6 = &psVar4->_M_string_length;
  }
  sVar5 = *psVar6;
  qVar7 = QPDFXRefEntry::getOffset(&this_00->xref);
  this_00->length = sVar5 - qVar7;
  return;
}

Assistant:

void
QPDFWriter::closeObject(int objid)
{
    // Write a newline before endobj as it makes the file easier to repair.
    writeString("\nendobj\n");
    writeStringQDF("\n");
    auto& new_obj = m->new_obj[objid];
    new_obj.length = m->pipeline->getCount() - new_obj.xref.getOffset();
}